

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

void TranslateModuleTypeDefinitions(ExpressionTranslateContext *ctx)

{
  ExpressionContext *pEVar1;
  ulong uVar2;
  
  PrintIndentedLine(ctx,"// Type definitions");
  PrintIndentedLine(ctx,"#pragma pack(push, 4)");
  pEVar1 = ctx->ctx;
  if ((pEVar1->types).count != 0) {
    uVar2 = 0;
    do {
      TranslateTypeDefinition(ctx,(pEVar1->types).data[uVar2]);
      uVar2 = uVar2 + 1;
      pEVar1 = ctx->ctx;
    } while (uVar2 < (pEVar1->types).count);
  }
  PrintIndentedLine(ctx,"#pragma pack(pop)");
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void TranslateModuleTypeDefinitions(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Type definitions");
	PrintIndentedLine(ctx, "#pragma pack(push, 4)");

	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
	{
		TypeBase *type = ctx.ctx.types[i];

		TranslateTypeDefinition(ctx, type);
	}
	PrintIndentedLine(ctx, "#pragma pack(pop)");

	PrintLine(ctx);
}